

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_iterator_previous(void **param_1)

{
  undefined1 uVar1;
  _Bool _Var2;
  int iVar3;
  size_type sVar4;
  roaring64_iterator_t *it_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  char *file;
  roaring64_bitmap_t *unaff_retaddr;
  roaring64_iterator_t *it;
  int i;
  uint64_t v;
  uint64_t i_1;
  roaring64_bulk_context_t context;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  roaring64_bitmap_t *r;
  int in_stack_ffffffffffffff6c;
  roaring64_bitmap_t *in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff80;
  roaring64_bulk_context_t *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  ulong local_50;
  undefined1 local_48 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  roaring64_bitmap_t *local_10;
  
  local_10 = roaring64_bitmap_create();
  pvVar5 = &local_28;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x108e0b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (size_type)in_stack_ffffffffffffff98);
  memset(local_48,0,0x10);
  for (local_50 = 0; local_50 < 1000; local_50 = local_50 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_ffffffffffffff80,
               (value_type *)
               CONCAT17(in_stack_ffffffffffffff7f,
                        CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
    roaring64_bitmap_add_bulk
              ((roaring64_bitmap_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98,(uint64_t)pvVar5);
  }
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_28);
  iVar3 = (int)sVar4 + -1;
  it_00 = roaring64_iterator_create_last(in_stack_ffffffffffffff70);
  do {
    pvVar5 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             roaring64_iterator_value(it_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_28,(long)iVar3);
    _assert_int_equal((unsigned_long)pvVar5,
                      CONCAT17(in_stack_ffffffffffffff7f,
                               CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),
                      (char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    iVar3 = iVar3 + -1;
    in_stack_ffffffffffffff7f =
         roaring64_iterator_previous
                   ((roaring64_iterator_t *)
                    CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
  } while ((bool)in_stack_ffffffffffffff7f);
  _assert_int_equal((unsigned_long)pvVar5,
                    CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),
                    (char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  uVar1 = roaring64_iterator_advance
                    ((roaring64_iterator_t *)
                     CONCAT17(in_stack_ffffffffffffff7f,
                              CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
  _assert_true((unsigned_long)pvVar5,
               (char *)CONCAT17(in_stack_ffffffffffffff7f,CONCAT16(uVar1,in_stack_ffffffffffffff78))
               ,(char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  iVar3 = iVar3 + 1;
  file = (char *)roaring64_iterator_value(it_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_28,(long)iVar3);
  _assert_int_equal((unsigned_long)pvVar5,
                    CONCAT17(in_stack_ffffffffffffff7f,CONCAT16(uVar1,in_stack_ffffffffffffff78)),
                    file,in_stack_ffffffffffffff6c);
  _Var2 = roaring64_iterator_previous
                    ((roaring64_iterator_t *)
                     CONCAT17(in_stack_ffffffffffffff7f,CONCAT16(uVar1,in_stack_ffffffffffffff78)));
  _assert_true((unsigned_long)pvVar5,
               (char *)CONCAT17(in_stack_ffffffffffffff7f,CONCAT16(uVar1,in_stack_ffffffffffffff78))
               ,file,CONCAT13(_Var2,(int3)in_stack_ffffffffffffff6c));
  roaring64_iterator_free((roaring64_iterator_t *)0x109015);
  roaring64_bitmap_free(unaff_retaddr);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(pvVar5);
  return;
}

Assistant:

DEFINE_TEST(test_iterator_previous) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    std::vector<uint64_t> values;
    values.reserve(1000);
    roaring64_bulk_context_t context{};
    for (uint64_t i = 0; i < 1000; ++i) {
        uint64_t v = i * 10000;
        values.push_back(v);
        roaring64_bitmap_add_bulk(r, &context, v);
    }
    int i = ((int)values.size()) - 1;
    roaring64_iterator_t* it = roaring64_iterator_create_last(r);
    do {
        assert_int_equal(roaring64_iterator_value(it), values[i]);
        i--;
    } while (roaring64_iterator_previous(it));
    assert_int_equal(i, -1);

    // Check that we can move forward from before the first entry.
    assert_true(roaring64_iterator_advance(it));
    i++;
    assert_int_equal(roaring64_iterator_value(it), values[i]);

    // Check that we can't move backward again.
    assert_false(roaring64_iterator_previous(it));

    roaring64_iterator_free(it);
    roaring64_bitmap_free(r);
}